

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qarraydatapointer.h
# Opt level: O2

void __thiscall
QArrayDataPointer<void_*>::relocate(QArrayDataPointer<void_*> *this,qsizetype offset,void ***data)

{
  void **d_first;
  void **ppvVar1;
  
  d_first = this->ptr + offset;
  QtPrivate::q_relocate_overlap_n<void*,long_long>(this->ptr,this->size,d_first);
  if (data != (void ***)0x0) {
    ppvVar1 = *data;
    if ((this->ptr <= ppvVar1) && (ppvVar1 < this->ptr + this->size)) {
      *data = ppvVar1 + offset;
    }
  }
  this->ptr = d_first;
  return;
}

Assistant:

void relocate(qsizetype offset, const T **data = nullptr)
    {
        T *res = this->ptr + offset;
        QtPrivate::q_relocate_overlap_n(this->ptr, this->size, res);
        // first update data pointer, then this->ptr
        if (data && QtPrivate::q_points_into_range(*data, *this))
            *data += offset;
        this->ptr = res;
    }